

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.h
# Opt level: O2

void __thiscall
ccs::SearchState::cacheProperty
          (SearchState *this,string *propertyName,Specificity spec,Property *property)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  SearchState *this_01;
  bool bVar2;
  iterator iVar3;
  PropertySetting *pPVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_bool>
  pVar5;
  PropertySetting newSetting;
  Property *local_d8;
  PropertySetting local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
  local_90;
  
  this_00 = &this->properties;
  local_d8 = property;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
          ::find(&this_00->_M_t,propertyName);
  PropertySetting::PropertySetting(&local_d0,spec,property);
  p_Var1 = &(this->properties)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)iVar3._M_node == p_Var1) &&
     (this_01 = (this->parent).
                super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_01 != (SearchState *)0x0)) {
    pPVar4 = checkCache(this_01,propertyName);
    if (pPVar4 != (PropertySetting *)0x0) {
      bVar2 = PropertySetting::better(pPVar4,&local_d0);
      if (bVar2) goto LAB_001458cb;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_true>
                (&local_90,propertyName,pPVar4);
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,ccs::PropertySetting>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                          *)this_00,&local_90);
      iVar3._M_node = (_Base_ptr)pVar5.first._M_node;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
      ::~pair(&local_90);
    }
  }
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
    ::pair<ccs::PropertySetting_&,_true>(&local_90,propertyName,&local_d0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,ccs::PropertySetting>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                *)this_00,&local_90);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
    ::~pair(&local_90);
  }
  else {
    pPVar4 = (PropertySetting *)(iVar3._M_node + 2);
    bVar2 = PropertySetting::better(&local_d0,pPVar4);
    if (bVar2) {
      PropertySetting::operator=(pPVar4,&local_d0);
    }
    else {
      bVar2 = PropertySetting::better(pPVar4,&local_d0);
      if (!bVar2) {
        std::
        _Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
        ::_M_insert_unique<ccs::Property_const*const&>
                  ((_Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
                    *)&iVar3._M_node[2]._M_left,&local_d8);
      }
    }
  }
LAB_001458cb:
  std::
  _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
  ::~_Rb_tree(&local_d0.values._M_t);
  return;
}

Assistant:

void cacheProperty(const std::string &propertyName,
      Specificity spec, const Property *property) {
    auto it = properties.find(propertyName);

    PropertySetting newSetting(spec, property);

    if (it == properties.end()) {
      // we don't have a local setting for this yet.
      auto parentProperty = parent ? parent->checkCache(propertyName) : nullptr;
      if (parentProperty) {
        if (parentProperty->better(newSetting))
          // parent copy found, parent property better, leave local cache empty.
          return;

        // copy parent property into local cache. this is done solely to
        // support conflict detection.
        it = properties.insert(std::make_pair(propertyName, *parentProperty))
            .first;
      }
    }

    if (it == properties.end()) {
      properties.insert(std::make_pair(propertyName, newSetting));
    } else if (newSetting.better(it->second)) {
      // new property better than local cache. replace.
      it->second = newSetting;
    } else if (it->second.better(newSetting)) {
      // ignore
    } else {
      // new property has same specificity/override as existing... append.
      it->second.values.insert(property);
    }
  }